

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

int __thiscall
QPDF::outputLengthNextN(QPDF *this,int in_object,int n,NewObjTable *new_obj,ObjTable *obj)

{
  long lVar1;
  longlong lVar2;
  Object *pOVar3;
  NewObject *pNVar4;
  int iVar5;
  int i;
  int iVar6;
  qpdf_offset_t length;
  allocator<char> local_61;
  longlong local_60;
  QPDF *local_58;
  string local_50;
  
  local_58 = this;
  pOVar3 = ObjTable<QPDFWriter::Object>::operator[]
                     (&obj->super_ObjTable<QPDFWriter::Object>,in_object);
  iVar6 = pOVar3->renumber;
  if (iVar6 < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "found object that is not renumbered while writing linearization data",
               (allocator<char> *)&local_60);
    stopOnError(local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  iVar5 = n + iVar6;
  local_60 = 0;
  for (; lVar2 = local_60, iVar6 < iVar5; iVar6 = iVar6 + 1) {
    pNVar4 = ObjTable<QPDFWriter::NewObject>::operator[]
                       (&new_obj->super_ObjTable<QPDFWriter::NewObject>,iVar6);
    lVar1 = pNVar4->length;
    if (lVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "found item with unknown length while writing linearization data",&local_61);
      stopOnError(local_58,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    local_60 = lVar2 + lVar1;
  }
  iVar6 = QIntC::IntConverter<long_long,_int,_true,_true>::convert(&local_60);
  return iVar6;
}

Assistant:

int
QPDF::outputLengthNextN(
    int in_object, int n, QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    // Figure out the length of a series of n consecutive objects in the output file starting with
    // whatever object in_object from the input file mapped to.

    int first = obj[in_object].renumber;
    int last = first + n;
    if (first <= 0) {
        stopOnError("found object that is not renumbered while writing linearization data");
    }
    qpdf_offset_t length = 0;
    for (int i = first; i < last; ++i) {
        auto l = new_obj[i].length;
        if (l == 0) {
            stopOnError("found item with unknown length while writing linearization data");
        }
        length += l;
    }
    return toI(length);
}